

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::IsSealed
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  bool bVar1;
  int iVar2;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar3;
  BOOL BVar4;
  uint index;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  ushort uVar5;
  
  BVar4 = 0;
  if (((this->super_DynamicTypeHandler).flags & 1) == 0) {
    this_00 = (this->propertyMap).ptr;
    if (0 < this_00->count - this_00->freeCount) {
      uVar5 = 1;
      index = 0;
      do {
        pDVar3 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(this_00,index);
        if ((pDVar3->Attributes & 0x1a) == 2) {
          return 0;
        }
        index = (uint)uVar5;
        this_00 = (this->propertyMap).ptr;
        uVar5 = uVar5 + 1;
      } while ((int)index < this_00->count - this_00->freeCount);
    }
    bVar1 = DynamicObject::HasObjectArray(instance);
    if ((*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar1) &&
       (iVar2 = (**(code **)(**(long **)&(instance->field_1).field_1 + 0x1c8))(), iVar2 == 0)) {
      return 0;
    }
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        DictionaryPropertyDescriptor<T> *descriptor = nullptr;
        for (T index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    // [[Configurable]] must be false for all (existing) properties.
                    // IE9 compatibility: keep IE9 behavior (also check deleted properties)
                    return false;
                }
            }
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsSealed())
        {
            return false;
        }

        return true;
    }